

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O3

Gia_Man_t * Bmc_CexTarget(Gia_Man_t *p,int nFrames)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  int iVar;
  int iVar3;
  Gia_Man_t *local_38;
  
  iVar3 = (p->vCis->nSize - p->nRegs) * nFrames;
  pGVar1 = Bmc_CexTargetEnlarge(p,nFrames);
  if (0 < iVar3) {
    iVar = 0;
    pGVar2 = pGVar1;
    do {
      printf("%3d : ");
      if (iVar % (p->vCis->nSize - p->nRegs) == 0) {
        Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
      }
      pGVar1 = Gia_ManDupExist(pGVar2,iVar);
      Gia_ManStop(pGVar2);
      iVar = iVar + 1;
      pGVar2 = pGVar1;
    } while (iVar3 != iVar);
  }
  Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  pGVar2 = Gia_ManDupLastPis(pGVar1,p->nRegs);
  local_38 = pGVar2;
  Gia_ManStop(pGVar1);
  Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  pGVar1 = Gia_ManDupAppendCones(p,&local_38,1,1);
  Gia_ManStop(local_38);
  Gia_AigerWrite(pGVar1,"miter3.aig",0,0);
  return pGVar1;
}

Assistant:

Gia_Man_t * Bmc_CexTarget( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pTemp;
    int i, Limit = nFrames * Gia_ManPiNum(p);
    pNew = Bmc_CexTargetEnlarge( p, nFrames );
    for ( i = 0; i < Limit; i++ )
    {
        printf( "%3d : ", i );
        if ( i % Gia_ManPiNum(p) == 0 )
            Gia_ManPrintStats( pNew, NULL );
        pNew = Gia_ManDupExist( pTemp = pNew, i );
        Gia_ManStop( pTemp );
    }
    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManDupLastPis( pTemp = pNew, Gia_ManRegNum(p) );
    Gia_ManStop( pTemp );  
    Gia_ManPrintStats( pNew, NULL );
    pTemp = Gia_ManDupAppendCones( p, &pNew, 1, 1 );
    Gia_ManStop( pNew );
    Gia_AigerWrite( pTemp, "miter3.aig", 0, 0 );
    return pTemp;
}